

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O3

void duckdb_snappy::RawCompressFromIOVec
               (iovec *iov,size_t uncompressed_length,char *compressed,size_t *compressed_length,
               CompressionOptions options)

{
  SnappyIOVecReader reader;
  UncheckedByteArraySink writer;
  ByteArraySource local_48;
  size_t sStack_30;
  size_t local_28;
  UncheckedByteArraySink local_20;
  
  local_48.super_Source._vptr_Source = (_func_int **)&PTR__ByteArraySource_02485850;
  local_48.ptr_ = (char *)iov;
  if (uncompressed_length == 0) {
    local_48.left_ = 0;
    sStack_30 = 0;
    local_28 = 0;
  }
  else {
    local_48.left_ = (size_t)iov->iov_base;
    sStack_30 = iov->iov_len;
    local_28 = uncompressed_length;
    if (sStack_30 == 0) {
      do {
        sStack_30 = iov[1].iov_len;
        iov = iov + 1;
      } while (sStack_30 == 0);
      local_48.left_ = (size_t)iov->iov_base;
      local_48.ptr_ = (char *)iov;
    }
  }
  local_20.super_Sink._vptr_Sink = (_func_int **)&PTR__UncheckedByteArraySink_02485988;
  local_20.dest_ = compressed;
  Compress(&local_48.super_Source,&local_20.super_Sink,options);
  *compressed_length = (long)local_20.dest_ - (long)compressed;
  UncheckedByteArraySink::~UncheckedByteArraySink(&local_20);
  ByteArraySource::~ByteArraySource(&local_48);
  return;
}

Assistant:

void RawCompressFromIOVec(const struct iovec* iov, size_t uncompressed_length,
                          char* compressed, size_t* compressed_length,
                          CompressionOptions options) {
  SnappyIOVecReader reader(iov, uncompressed_length);
  UncheckedByteArraySink writer(compressed);
  Compress(&reader, &writer, options);

  // Compute how many bytes were added.
  *compressed_length = writer.CurrentDestination() - compressed;
}